

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O1

string * ws::wx_decrypt_aes(string *__return_storage_ptr__,string *str_encrypt,string *key)

{
  uchar *out;
  runtime_error *prVar1;
  size_t __n;
  size_type __n_00;
  uchar iv [16];
  uchar ckey [32];
  AES_KEY aesKey;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  AES_KEY local_124;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  out = (uchar *)malloc(str_encrypt->_M_string_length);
  if (out == (uchar *)0x0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x18);
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"malloc error","");
    std::runtime_error::runtime_error(prVar1,(string *)local_168);
    *(undefined ***)prVar1 = &PTR__runtime_error_0019fd30;
    *(undefined ***)(prVar1 + 0x10) = &PTR_s__workspace_llm4binary_github_lic_0019f138;
    __cxa_throw(prVar1,&MsgCryptoError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_198 = 0;
  uStack_190 = 0;
  __n = 0x20;
  if (key->_M_string_length < 0x20) {
    __n = key->_M_string_length;
  }
  memcpy(&local_148,(key->_M_dataplus)._M_p,__n);
  local_198 = local_148;
  uStack_190 = uStack_140;
  AES_set_decrypt_key((uchar *)&local_148,0x100,&local_124);
  AES_cbc_encrypt((uchar *)(str_encrypt->_M_dataplus)._M_p,out,str_encrypt->_M_string_length,
                  &local_124,(uchar *)&local_198,0);
  if (((byte)(out[str_encrypt->_M_string_length - 1] - 1) < 0x20) &&
     (__n_00 = str_encrypt->_M_string_length - (ulong)out[str_encrypt->_M_string_length - 1],
     __n_00 != 0)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,(char *)out,__n_00);
    free(out);
    return __return_storage_ptr__;
  }
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x18);
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"wx_decrypt_aes failed.","");
  std::runtime_error::runtime_error(prVar1,(string *)local_188);
  *(undefined ***)prVar1 = &PTR__runtime_error_0019fd30;
  *(undefined ***)(prVar1 + 0x10) = &PTR_s__workspace_llm4binary_github_lic_0019f150;
  __cxa_throw(prVar1,&MsgCryptoError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string wx_decrypt_aes(const std::string &str_encrypt, const std::string &key)
  {
    std::string result;
  
  
    auto out = (unsigned char *) malloc(str_encrypt.size());
    if (out == nullptr)
    {
      throw MsgCryptoError("malloc error");
    }
  
    unsigned char ckey[32] = {0};
    unsigned char iv[16] = {0};
    memcpy(ckey, key.c_str(), key.size() > 32 ? 32 : key.size());
    //memcpy(iv, ckey, sizeof(iv) < sizeof(ckey) ? sizeof(iv) : sizeof(ckey));
    memcpy(iv, ckey, sizeof(iv));
    
    AES_KEY aesKey;
    AES_set_decrypt_key(ckey, 8 * 32, &aesKey);
    AES_cbc_encrypt((unsigned char *) str_encrypt.c_str(), out, str_encrypt.size(), &aesKey, iv, AES_DECRYPT);
    if (out[str_encrypt.size() - 1] > 0 && out[str_encrypt.size() - 1] <= 32 &&
        (str_encrypt.size() - out[str_encrypt.size() - 1]) > 0)
      result.append((char *) out, str_encrypt.size() - out[str_encrypt.size() - 1]);
    else
    {
      throw MsgCryptoError("wx_decrypt_aes failed.");
    }
  
    free(out);
    return result;
  }